

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_avx2.c
# Opt level: O1

void iadst16_low1_avx2(__m256i *in,__m256i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined4 uVar1;
  __m256i alVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  __m256i alVar8;
  __m256i alVar9;
  __m256i alVar10;
  undefined1 auVar11 [32];
  int iVar12;
  int iVar13;
  long lVar14;
  undefined1 auVar15 [32];
  __m256i alVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  longlong local_88;
  longlong lStack_80;
  longlong lStack_78;
  longlong lStack_70;
  longlong local_48;
  longlong lStack_40;
  longlong lStack_38;
  longlong lStack_30;
  longlong local_28;
  longlong lStack_20;
  longlong lStack_18;
  longlong lStack_10;
  
  lVar14 = (long)bit * 0x100;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar14 + 0x168);
  auVar15._4_4_ = uVar1;
  auVar15._0_4_ = uVar1;
  auVar15._8_4_ = uVar1;
  auVar15._12_4_ = uVar1;
  auVar15._16_4_ = uVar1;
  auVar15._20_4_ = uVar1;
  auVar15._24_4_ = uVar1;
  auVar15._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar14 + 600);
  auVar17._4_4_ = uVar1;
  auVar17._0_4_ = uVar1;
  auVar17._8_4_ = uVar1;
  auVar17._12_4_ = uVar1;
  auVar17._16_4_ = uVar1;
  auVar17._20_4_ = uVar1;
  auVar17._24_4_ = uVar1;
  auVar17._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar14 + 0x180);
  auVar23._4_4_ = uVar1;
  auVar23._0_4_ = uVar1;
  auVar23._8_4_ = uVar1;
  auVar23._12_4_ = uVar1;
  auVar23._16_4_ = uVar1;
  auVar23._20_4_ = uVar1;
  auVar23._24_4_ = uVar1;
  auVar23._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar14 + 0x240);
  auVar20._4_4_ = uVar1;
  auVar20._0_4_ = uVar1;
  auVar20._8_4_ = uVar1;
  auVar20._12_4_ = uVar1;
  auVar20._16_4_ = uVar1;
  auVar20._20_4_ = uVar1;
  auVar20._24_4_ = uVar1;
  auVar20._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar14 + 0x220);
  auVar19._4_4_ = uVar1;
  auVar19._0_4_ = uVar1;
  auVar19._8_4_ = uVar1;
  auVar19._12_4_ = uVar1;
  auVar19._16_4_ = uVar1;
  auVar19._20_4_ = uVar1;
  auVar19._24_4_ = uVar1;
  auVar19._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar14 + 0x1a0);
  auVar24._4_4_ = uVar1;
  auVar24._0_4_ = uVar1;
  auVar24._8_4_ = uVar1;
  auVar24._12_4_ = uVar1;
  auVar24._16_4_ = uVar1;
  auVar24._20_4_ = uVar1;
  auVar24._24_4_ = uVar1;
  auVar24._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar14 + 0x1e0);
  auVar21._4_4_ = uVar1;
  auVar21._0_4_ = uVar1;
  auVar21._8_4_ = uVar1;
  auVar21._12_4_ = uVar1;
  auVar21._16_4_ = uVar1;
  auVar21._20_4_ = uVar1;
  auVar21._24_4_ = uVar1;
  auVar21._28_4_ = uVar1;
  iVar13 = 1 << ((char)bit - 1U & 0x1f);
  auVar18._4_4_ = iVar13;
  auVar18._0_4_ = iVar13;
  auVar18._8_4_ = iVar13;
  auVar18._12_4_ = iVar13;
  auVar18._16_4_ = iVar13;
  auVar18._20_4_ = iVar13;
  auVar18._24_4_ = iVar13;
  auVar18._28_4_ = iVar13;
  auVar17 = vpmulld_avx2((undefined1  [32])*in,auVar17);
  auVar17 = vpaddd_avx2(auVar17,auVar18);
  alVar2 = (__m256i)vpsrad_avx2(auVar17,ZEXT416((uint)bit));
  auVar17 = vpmulld_avx2((undefined1  [32])*in,auVar15);
  auVar17 = vpsubd_avx2(auVar18,auVar17);
  auVar3 = vpsrad_avx2(auVar17,ZEXT416((uint)bit));
  auVar17 = vpmulld_avx2((undefined1  [32])alVar2,auVar23);
  auVar15 = vpmulld_avx2(auVar3,auVar20);
  auVar17 = vpaddd_avx2(auVar17,auVar18);
  auVar17 = vpaddd_avx2(auVar15,auVar17);
  auVar22 = ZEXT416((uint)bit);
  auVar4 = vpsrad_avx2(auVar17,auVar22);
  auVar17 = vpmulld_avx2((undefined1  [32])alVar2,auVar20);
  auVar15 = vpmulld_avx2(auVar23,auVar3);
  auVar17 = vpaddd_avx2(auVar17,auVar18);
  auVar17 = vpsubd_avx2(auVar17,auVar15);
  auVar5 = vpsrad_avx2(auVar17,auVar22);
  auVar17 = vpmulld_avx2((undefined1  [32])alVar2,auVar24);
  auVar15 = vpmulld_avx2(auVar3,auVar19);
  auVar17 = vpaddd_avx2(auVar17,auVar18);
  auVar17 = vpaddd_avx2(auVar15,auVar17);
  auVar6 = vpsrad_avx2(auVar17,auVar22);
  auVar17 = vpmulld_avx2((undefined1  [32])alVar2,auVar19);
  auVar15 = vpmulld_avx2(auVar24,auVar3);
  auVar17 = vpaddd_avx2(auVar17,auVar18);
  auVar17 = vpsubd_avx2(auVar17,auVar15);
  auVar7 = vpsrad_avx2(auVar17,auVar22);
  auVar17 = vpmulld_avx2(auVar4,auVar24);
  auVar15 = vpmulld_avx2(auVar5,auVar19);
  auVar17 = vpaddd_avx2(auVar17,auVar18);
  auVar17 = vpaddd_avx2(auVar17,auVar15);
  auVar15 = vpmulld_avx2(auVar4,auVar19);
  auVar19 = vpmulld_avx2(auVar24,auVar5);
  auVar15 = vpaddd_avx2(auVar15,auVar18);
  auVar11 = vpsubd_avx2(auVar15,auVar19);
  auVar15 = vpmulld_avx2((undefined1  [32])alVar2,auVar21);
  auVar23 = vpmulld_avx2(auVar3,auVar21);
  auVar15 = vpaddd_avx2(auVar15,auVar18);
  auVar19 = vpaddd_avx2(auVar15,auVar23);
  auVar25 = vpsubd_avx2(auVar15,auVar23);
  auVar15 = vpmulld_avx2(auVar6,auVar21);
  auVar24 = vpmulld_avx2(auVar7,auVar21);
  auVar15 = vpaddd_avx2(auVar15,auVar18);
  auVar23 = vpaddd_avx2(auVar15,auVar24);
  auVar26 = vpsubd_avx2(auVar15,auVar24);
  auVar15 = vpmulld_avx2(auVar4,auVar21);
  auVar15 = vpaddd_avx2(auVar15,auVar18);
  auVar20 = vpmulld_avx2(auVar5,auVar21);
  auVar24 = vpaddd_avx2(auVar15,auVar20);
  auVar27 = vpsubd_avx2(auVar15,auVar20);
  auVar22 = ZEXT416((uint)bit);
  alVar16 = (__m256i)vpsrad_avx2(auVar17,auVar22);
  auVar17 = vpmulld_avx2((undefined1  [32])alVar16,auVar21);
  auVar17 = vpaddd_avx2(auVar17,auVar18);
  auVar11 = vpsrad_avx2(auVar11,auVar22);
  auVar20 = vpmulld_avx2(auVar11,auVar21);
  auVar15 = vpaddd_avx2(auVar17,auVar20);
  auVar20 = vpsubd_avx2(auVar17,auVar20);
  auVar17 = vpsrad_avx2(auVar19,auVar22);
  auVar19 = vpsrad_avx2(auVar25,auVar22);
  alVar8 = (__m256i)vpsrad_avx2(auVar23,auVar22);
  auVar23 = vpsrad_avx2(auVar26,auVar22);
  alVar9 = (__m256i)vpsrad_avx2(auVar24,auVar22);
  auVar24 = vpsrad_avx2(auVar27,auVar22);
  auVar15 = vpsrad_avx2(auVar15,ZEXT416((uint)bit));
  alVar10 = (__m256i)vpsrad_avx2(auVar20,ZEXT416((uint)bit));
  if (do_cols == 0) {
    iVar13 = 10;
    if (10 < bd) {
      iVar13 = bd;
    }
    iVar13 = 0x20 << ((byte)iVar13 & 0x1f);
    iVar12 = -iVar13;
    auVar25._4_4_ = iVar12;
    auVar25._0_4_ = iVar12;
    auVar25._8_4_ = iVar12;
    auVar25._12_4_ = iVar12;
    auVar25._16_4_ = iVar12;
    auVar25._20_4_ = iVar12;
    auVar25._24_4_ = iVar12;
    auVar25._28_4_ = iVar12;
    iVar13 = iVar13 + -1;
    auVar26._4_4_ = iVar13;
    auVar26._0_4_ = iVar13;
    auVar26._8_4_ = iVar13;
    auVar26._12_4_ = iVar13;
    auVar26._16_4_ = iVar13;
    auVar26._20_4_ = iVar13;
    auVar26._24_4_ = iVar13;
    auVar26._28_4_ = iVar13;
    iVar13 = (1 << ((byte)out_shift & 0x1f)) >> 1;
    auVar27._4_4_ = iVar13;
    auVar27._0_4_ = iVar13;
    auVar27._8_4_ = iVar13;
    auVar27._12_4_ = iVar13;
    auVar27._16_4_ = iVar13;
    auVar27._20_4_ = iVar13;
    auVar27._24_4_ = iVar13;
    auVar27._28_4_ = iVar13;
    auVar20 = vpaddd_avx2(auVar27,(undefined1  [32])alVar2);
    auVar4 = vpsubd_avx2(auVar27,auVar4);
    auVar20 = vpsrad_avx2(auVar20,ZEXT416((uint)out_shift));
    auVar4 = vpsrad_avx2(auVar4,ZEXT416((uint)out_shift));
    auVar20 = vpmaxsd_avx2(auVar20,auVar25);
    alVar2 = (__m256i)vpminsd_avx2(auVar20,auVar26);
    *out = alVar2;
    auVar20 = vpmaxsd_avx2(auVar4,auVar25);
    alVar2 = (__m256i)vpminsd_avx2(auVar20,auVar26);
    out[1] = alVar2;
    auVar20 = vpaddd_avx2((undefined1  [32])alVar16,auVar27);
    auVar4 = vpsubd_avx2(auVar27,auVar6);
    auVar22 = ZEXT416((uint)out_shift);
    auVar20 = vpsrad_avx2(auVar20,auVar22);
    auVar4 = vpsrad_avx2(auVar4,auVar22);
    auVar20 = vpmaxsd_avx2(auVar20,auVar25);
    alVar2 = (__m256i)vpminsd_avx2(auVar20,auVar26);
    out[2] = alVar2;
    auVar20 = vpmaxsd_avx2(auVar4,auVar25);
    alVar2 = (__m256i)vpminsd_avx2(auVar20,auVar26);
    out[3] = alVar2;
    auVar20 = vpaddd_avx2(auVar27,(undefined1  [32])alVar8);
    auVar4 = vpsubd_avx2(auVar27,auVar15);
    auVar15 = vpsrad_avx2(auVar20,auVar22);
    auVar20 = vpsrad_avx2(auVar4,auVar22);
    auVar15 = vpmaxsd_avx2(auVar15,auVar25);
    alVar2 = (__m256i)vpminsd_avx2(auVar15,auVar26);
    out[4] = alVar2;
    auVar15 = vpmaxsd_avx2(auVar20,auVar25);
    alVar2 = (__m256i)vpminsd_avx2(auVar15,auVar26);
    out[5] = alVar2;
    auVar15 = vpaddd_avx2((undefined1  [32])alVar9,auVar27);
    auVar20 = vpsubd_avx2(auVar27,auVar17);
    auVar22 = ZEXT416((uint)out_shift);
    auVar17 = vpsrad_avx2(auVar15,auVar22);
    auVar15 = vpsrad_avx2(auVar20,auVar22);
    auVar17 = vpmaxsd_avx2(auVar17,auVar25);
    alVar2 = (__m256i)vpminsd_avx2(auVar17,auVar26);
    out[6] = alVar2;
    auVar17 = vpmaxsd_avx2(auVar15,auVar25);
    alVar2 = (__m256i)vpminsd_avx2(auVar17,auVar26);
    out[7] = alVar2;
    auVar17 = vpaddd_avx2(auVar27,auVar19);
    auVar15 = vpsubd_avx2(auVar27,auVar24);
    auVar17 = vpsrad_avx2(auVar17,auVar22);
    auVar15 = vpsrad_avx2(auVar15,auVar22);
    auVar17 = vpmaxsd_avx2(auVar17,auVar25);
    alVar2 = (__m256i)vpminsd_avx2(auVar17,auVar26);
    out[8] = alVar2;
    auVar17 = vpmaxsd_avx2(auVar15,auVar25);
    alVar2 = (__m256i)vpminsd_avx2(auVar17,auVar26);
    out[9] = alVar2;
    auVar17 = vpaddd_avx2(auVar27,(undefined1  [32])alVar10);
    auVar15 = vpsubd_avx2(auVar27,auVar23);
    auVar17 = vpsrad_avx2(auVar17,auVar22);
    auVar15 = vpsrad_avx2(auVar15,auVar22);
    auVar17 = vpmaxsd_avx2(auVar17,auVar25);
    alVar2 = (__m256i)vpminsd_avx2(auVar17,auVar26);
    out[10] = alVar2;
    auVar17 = vpmaxsd_avx2(auVar15,auVar25);
    alVar2 = (__m256i)vpminsd_avx2(auVar17,auVar26);
    out[0xb] = alVar2;
    auVar17 = vpaddd_avx2(auVar27,auVar7);
    auVar15 = vpsubd_avx2(auVar27,auVar11);
    auVar17 = vpsrad_avx2(auVar17,auVar22);
    auVar15 = vpsrad_avx2(auVar15,auVar22);
    auVar17 = vpmaxsd_avx2(auVar17,auVar25);
    alVar2 = (__m256i)vpminsd_avx2(auVar17,auVar26);
    out[0xc] = alVar2;
    auVar17 = vpmaxsd_avx2(auVar15,auVar25);
    alVar2 = (__m256i)vpminsd_avx2(auVar17,auVar26);
    out[0xd] = alVar2;
    auVar17 = vpaddd_avx2(auVar27,auVar5);
    auVar15 = vpsubd_avx2(auVar27,auVar3);
    auVar17 = vpsrad_avx2(auVar17,ZEXT416((uint)out_shift));
    auVar15 = vpsrad_avx2(auVar15,ZEXT416((uint)out_shift));
    auVar17 = vpmaxsd_avx2(auVar17,auVar25);
    auVar15 = vpmaxsd_avx2(auVar15,auVar25);
    alVar2 = (__m256i)vpminsd_avx2(auVar17,auVar26);
    alVar16 = (__m256i)vpminsd_avx2(auVar15,auVar26);
    out[0xe] = alVar2;
  }
  else {
    *out = alVar2;
    auVar20 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    alVar2 = (__m256i)vpsubd_avx2(auVar20,auVar4);
    out[1] = alVar2;
    out[2] = alVar16;
    alVar2 = (__m256i)vpsubd_avx2(auVar20,auVar6);
    out[3] = alVar2;
    out[4] = alVar8;
    alVar2 = (__m256i)vpsubd_avx2(auVar20,auVar15);
    out[5] = alVar2;
    out[6] = alVar9;
    alVar2 = (__m256i)vpsubd_avx2(auVar20,auVar17);
    out[7] = alVar2;
    local_88 = auVar19._0_8_;
    lStack_80 = auVar19._8_8_;
    lStack_78 = auVar19._16_8_;
    lStack_70 = auVar19._24_8_;
    out[8][0] = local_88;
    out[8][1] = lStack_80;
    out[8][2] = lStack_78;
    out[8][3] = lStack_70;
    alVar2 = (__m256i)vpsubd_avx2(auVar20,auVar24);
    out[9] = alVar2;
    out[10] = alVar10;
    alVar2 = (__m256i)vpsubd_avx2(auVar20,auVar23);
    out[0xb] = alVar2;
    local_48 = auVar7._0_8_;
    lStack_40 = auVar7._8_8_;
    lStack_38 = auVar7._16_8_;
    lStack_30 = auVar7._24_8_;
    out[0xc][0] = local_48;
    out[0xc][1] = lStack_40;
    out[0xc][2] = lStack_38;
    out[0xc][3] = lStack_30;
    alVar2 = (__m256i)vpsubd_avx2(auVar20,auVar11);
    out[0xd] = alVar2;
    local_28 = auVar5._0_8_;
    lStack_20 = auVar5._8_8_;
    lStack_18 = auVar5._16_8_;
    lStack_10 = auVar5._24_8_;
    out[0xe][0] = local_28;
    out[0xe][1] = lStack_20;
    out[0xe][2] = lStack_18;
    out[0xe][3] = lStack_10;
    alVar16 = (__m256i)vpsubd_avx2(auVar20,auVar3);
  }
  out[0xf] = alVar16;
  return;
}

Assistant:

static void iadst16_low1_avx2(const __m256i *input, __m256i *output) {
  const int32_t *cospi = cospi_arr(INV_COS_BIT);
  const __m256i _r = _mm256_set1_epi32(1 << (INV_COS_BIT - 1));

  const __m256i cospi_p08_p56 = pair_set_w16_epi16(cospi[8], cospi[56]);
  const __m256i cospi_p56_m08 = pair_set_w16_epi16(cospi[56], -cospi[8]);
  const __m256i cospi_p16_p48 = pair_set_w16_epi16(cospi[16], cospi[48]);
  const __m256i cospi_p48_m16 = pair_set_w16_epi16(cospi[48], -cospi[16]);

  // stage 1
  __m256i x1[16];
  x1[1] = input[0];

  // stage 2
  btf_16_w16_0_avx2(cospi[62], -cospi[2], x1[1], x1[0], x1[1]);

  // stage 3
  x1[8] = x1[0];
  x1[9] = x1[1];

  // stage 4
  btf_16_w16_avx2(cospi_p08_p56, cospi_p56_m08, &x1[8], &x1[9], _r,
                  INV_COS_BIT);

  // stage 5
  x1[4] = x1[0];
  x1[5] = x1[1];

  x1[12] = x1[8];
  x1[13] = x1[9];

  // stage 6
  btf_16_w16_avx2(cospi_p16_p48, cospi_p48_m16, &x1[4], &x1[5], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p16_p48, cospi_p48_m16, &x1[12], &x1[13], _r,
                  INV_COS_BIT);

  // stage 7
  x1[2] = x1[0];
  x1[3] = x1[1];
  x1[6] = x1[4];
  x1[7] = x1[5];
  x1[10] = x1[8];
  x1[11] = x1[9];
  x1[14] = x1[12];
  x1[15] = x1[13];

  iadst16_stage8_avx2(x1, cospi, _r, INV_COS_BIT);
  iadst16_stage9_avx2(output, x1);
}